

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void Js::EnsureBuiltInEngineIsReady(JsBuiltInFile file,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *this;
  EngineInterfaceObject *this_00;
  undefined4 *puVar4;
  JsBuiltInEngineInterfaceExtensionObject *this_01;
  JsBuiltInEngineInterfaceExtensionObject *builtInExtension;
  EngineInterfaceObject *engineInterfaceObject;
  ScriptContext *scriptContext_local;
  JsBuiltInFile file_local;
  
  bVar2 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if ((bVar2) &&
     (BVar3 = ScriptContext::VerifyAlive(scriptContext,0,(ScriptContext *)0x0), BVar3 != 0)) {
    this = ScriptContext::GetLibrary(scriptContext);
    this_00 = JavascriptLibraryBase::GetEngineInterfaceObject(&this->super_JavascriptLibraryBase);
    if (this_00 == (EngineInterfaceObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x789,"(engineInterfaceObject != nullptr)",
                                  "engineInterfaceObject != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_01 = (JsBuiltInEngineInterfaceExtensionObject *)
              EngineInterfaceObject::GetEngineExtension
                        (this_00,EngineInterfaceExtensionKind_JsBuiltIn);
    JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode(this_01,scriptContext,file);
  }
  return;
}

Assistant:

void EnsureBuiltInEngineIsReady(JsBuiltInFile file, ScriptContext* scriptContext)
    {
        if (scriptContext->IsJsBuiltInEnabled())
        {
            if (scriptContext->VerifyAlive())  // Can't initialize if scriptContext closed, will need to run script
            {
                EngineInterfaceObject* engineInterfaceObject = scriptContext->GetLibrary()->GetEngineInterfaceObject();
                Assert(engineInterfaceObject != nullptr);
                JsBuiltInEngineInterfaceExtensionObject* builtInExtension =
                    static_cast<JsBuiltInEngineInterfaceExtensionObject*>(engineInterfaceObject->GetEngineExtension(EngineInterfaceExtensionKind_JsBuiltIn));
                builtInExtension->InjectJsBuiltInLibraryCode(scriptContext, file);
            }
        }
    }